

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_debug.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
phmap::priv::GetHashtableDebugNumProbesHistogram<phmap::priv::(anonymous_namespace)::IntTable>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          IntTable *container)

{
  bool bVar1;
  reference key;
  key_type *key_00;
  unsigned_long *puVar2;
  reference pvVar3;
  iterator iVar4;
  const_iterator cVar5;
  unsigned_long local_68;
  size_type local_60;
  size_t local_58;
  size_t num_probes;
  anon_union_8_1_a8a14541_for_iterator_1 local_48;
  undefined1 local_30 [8];
  const_iterator it;
  IntTable *container_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *v;
  
  it.inner_.field_1._7_1_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  iVar4 = (iterator)
          raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          ::begin(&container->
                   super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                 );
  while( true ) {
    it.inner_.ctrl_ = (ctrl_t *)iVar4.field_1;
    local_30 = (undefined1  [8])iVar4.ctrl_;
    cVar5 = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
            ::end(&container->
                   super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                 );
    local_48 = cVar5.inner_.field_1;
    num_probes = (size_t)cVar5.inner_.ctrl_;
    bVar1 = operator!=((const_iterator *)local_30,(const_iterator *)&num_probes);
    if (!bVar1) break;
    key = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          ::const_iterator::operator*((const_iterator *)local_30);
    key_00 = hashtable_debug_internal::GetKey<phmap::priv::(anonymous_namespace)::IntTable>
                       (key,'\0');
    local_58 = GetHashtableDebugNumProbes<phmap::priv::(anonymous_namespace)::IntTable>
                         (container,key_00);
    local_60 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         (__return_storage_ptr__);
    local_68 = local_58 + 1;
    puVar2 = std::max<unsigned_long>(&local_60,&local_68);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (__return_storage_ptr__,*puVar2);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (__return_storage_ptr__,local_58);
    *pvVar3 = *pvVar3 + 1;
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::const_iterator::operator++((const_iterator *)local_30);
    iVar4.field_1.slot_ = (slot_type *)it.inner_.ctrl_;
    iVar4.ctrl_ = (ctrl_t *)local_30;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> GetHashtableDebugNumProbesHistogram(const C& container) {
  std::vector<size_t> v;
  for (auto it = container.begin(); it != container.end(); ++it) {
    size_t num_probes = GetHashtableDebugNumProbes(
        container,
        phmap::priv::hashtable_debug_internal::GetKey<C>(*it, 0));
    v.resize((std::max)(v.size(), num_probes + 1));
    v[num_probes]++;
  }
  return v;
}